

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsontz.cpp
# Opt level: O0

void __thiscall
icu_63::OlsonTimeZone::getHistoricalOffset
          (OlsonTimeZone *this,UDate date,UBool local,int32_t NonExistingTimeOpt,
          int32_t DuplicatedTimeOpt,int32_t *rawoff,int32_t *dstoff)

{
  short sVar1;
  int32_t iVar2;
  int32_t iVar3;
  int32_t iVar4;
  int64_t iVar5;
  bool bVar6;
  bool bVar7;
  double dVar8;
  UBool stdToDst;
  UBool dstToStd;
  UBool dstAfter;
  int32_t offsetAfter;
  UBool dstBefore;
  int64_t iStack_58;
  int32_t offsetBefore;
  int64_t transition;
  int16_t transIdx;
  double sec;
  int16_t transCount;
  int32_t *dstoff_local;
  int32_t *rawoff_local;
  int32_t DuplicatedTimeOpt_local;
  int32_t NonExistingTimeOpt_local;
  UBool local_local;
  UDate date_local;
  OlsonTimeZone *this_local;
  
  sVar1 = transitionCount(this);
  if (sVar1 < 1) {
    iVar2 = initialRawOffset(this);
    *rawoff = iVar2 * 1000;
    iVar2 = initialDstOffset(this);
    *dstoff = iVar2 * 1000;
  }
  else {
    dVar8 = uprv_floor_63(date / 1000.0);
    if ((local != '\0') || (iVar5 = transitionTimeInSeconds(this,0), (double)iVar5 <= dVar8)) {
      do {
        transition._6_2_ = sVar1 + -1;
        if (transition._6_2_ < 0) break;
        iStack_58 = transitionTimeInSeconds(this,transition._6_2_);
        if ((local != '\0') && ((double)(iStack_58 + -0x15180) <= dVar8)) {
          iVar3 = zoneOffsetAt(this,sVar1 + -2);
          iVar2 = dstOffsetAt(this,sVar1 + -2);
          bVar6 = iVar2 == 0;
          iVar4 = zoneOffsetAt(this,transition._6_2_);
          iVar2 = dstOffsetAt(this,transition._6_2_);
          bVar7 = iVar2 != 0;
          iVar2 = iVar3;
          if (iVar4 - iVar3 < 0) {
            if (((((((DuplicatedTimeOpt & 3U) != 1) || (iVar2 = iVar4, bVar6 || bVar7)) &&
                  (((DuplicatedTimeOpt & 3U) != 3 || (iVar2 = iVar4, !bVar6 || !bVar7)))) &&
                 (((DuplicatedTimeOpt & 3U) != 1 || (iVar2 = iVar3, !bVar6 || !bVar7)))) &&
                (((DuplicatedTimeOpt & 3U) != 3 || (iVar2 = iVar3, bVar6 || bVar7)))) &&
               (iVar2 = iVar4, (DuplicatedTimeOpt & 0xcU) == 4)) {
              iVar2 = iVar3;
            }
          }
          else if ((((((NonExistingTimeOpt & 3U) != 1) || (bVar6 || bVar7)) &&
                    (((NonExistingTimeOpt & 3U) != 3 || (!bVar6 || !bVar7)))) &&
                   ((((NonExistingTimeOpt & 3U) != 1 || (iVar2 = iVar4, !bVar6 || !bVar7)) &&
                    (((NonExistingTimeOpt & 3U) != 3 || (iVar2 = iVar4, bVar6 || bVar7)))))) &&
                  (iVar2 = iVar4, (NonExistingTimeOpt & 0xcU) == 0xc)) {
            iVar2 = iVar3;
          }
          iStack_58 = iVar2 + iStack_58;
        }
        sVar1 = transition._6_2_;
      } while (dVar8 < (double)iStack_58);
      iVar2 = rawOffsetAt(this,transition._6_2_);
      *rawoff = iVar2 * 1000;
      iVar2 = dstOffsetAt(this,transition._6_2_);
      *dstoff = iVar2 * 1000;
    }
    else {
      iVar2 = initialRawOffset(this);
      *rawoff = iVar2 * 1000;
      iVar2 = initialDstOffset(this);
      *dstoff = iVar2 * 1000;
    }
  }
  return;
}

Assistant:

void
OlsonTimeZone::getHistoricalOffset(UDate date, UBool local,
                                   int32_t NonExistingTimeOpt, int32_t DuplicatedTimeOpt,
                                   int32_t& rawoff, int32_t& dstoff) const {
    U_DEBUG_TZ_MSG(("getHistoricalOffset(%.1f, %s, %d, %d, raw, dst)\n",
        date, local?"T":"F", NonExistingTimeOpt, DuplicatedTimeOpt));
#if defined U_DEBUG_TZ
        printTime(date*1000.0);
#endif
    int16_t transCount = transitionCount();

    if (transCount > 0) {
        double sec = uprv_floor(date / U_MILLIS_PER_SECOND);
        if (!local && sec < transitionTimeInSeconds(0)) {
            // Before the first transition time
            rawoff = initialRawOffset() * U_MILLIS_PER_SECOND;
            dstoff = initialDstOffset() * U_MILLIS_PER_SECOND;
        } else {
            // Linear search from the end is the fastest approach, since
            // most lookups will happen at/near the end.
            int16_t transIdx;
            for (transIdx = transCount - 1; transIdx >= 0; transIdx--) {
                int64_t transition = transitionTimeInSeconds(transIdx);

                if (local && (sec >= (transition - MAX_OFFSET_SECONDS))) {
                    int32_t offsetBefore = zoneOffsetAt(transIdx - 1);
                    UBool dstBefore = dstOffsetAt(transIdx - 1) != 0;

                    int32_t offsetAfter = zoneOffsetAt(transIdx);
                    UBool dstAfter = dstOffsetAt(transIdx) != 0;

                    UBool dstToStd = dstBefore && !dstAfter;
                    UBool stdToDst = !dstBefore && dstAfter;
                    
                    if (offsetAfter - offsetBefore >= 0) {
                        // Positive transition, which makes a non-existing local time range
                        if (((NonExistingTimeOpt & kStdDstMask) == kStandard && dstToStd)
                                || ((NonExistingTimeOpt & kStdDstMask) == kDaylight && stdToDst)) {
                            transition += offsetBefore;
                        } else if (((NonExistingTimeOpt & kStdDstMask) == kStandard && stdToDst)
                                || ((NonExistingTimeOpt & kStdDstMask) == kDaylight && dstToStd)) {
                            transition += offsetAfter;
                        } else if ((NonExistingTimeOpt & kFormerLatterMask) == kLatter) {
                            transition += offsetBefore;
                        } else {
                            // Interprets the time with rule before the transition,
                            // default for non-existing time range
                            transition += offsetAfter;
                        }
                    } else {
                        // Negative transition, which makes a duplicated local time range
                        if (((DuplicatedTimeOpt & kStdDstMask) == kStandard && dstToStd)
                                || ((DuplicatedTimeOpt & kStdDstMask) == kDaylight && stdToDst)) {
                            transition += offsetAfter;
                        } else if (((DuplicatedTimeOpt & kStdDstMask) == kStandard && stdToDst)
                                || ((DuplicatedTimeOpt & kStdDstMask) == kDaylight && dstToStd)) {
                            transition += offsetBefore;
                        } else if ((DuplicatedTimeOpt & kFormerLatterMask) == kFormer) {
                            transition += offsetBefore;
                        } else {
                            // Interprets the time with rule after the transition,
                            // default for duplicated local time range
                            transition += offsetAfter;
                        }
                    }
                }
                if (sec >= transition) {
                    break;
                }
            }
            // transIdx could be -1 when local=true
            rawoff = rawOffsetAt(transIdx) * U_MILLIS_PER_SECOND;
            dstoff = dstOffsetAt(transIdx) * U_MILLIS_PER_SECOND;
        }
    } else {
        // No transitions, single pair of offsets only
        rawoff = initialRawOffset() * U_MILLIS_PER_SECOND;
        dstoff = initialDstOffset() * U_MILLIS_PER_SECOND;
    }
    U_DEBUG_TZ_MSG(("getHistoricalOffset(%.1f, %s, %d, %d, raw, dst) - raw=%d, dst=%d\n",
        date, local?"T":"F", NonExistingTimeOpt, DuplicatedTimeOpt, rawoff, dstoff));
}